

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * uprv_decNumberAnd_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint8_t *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  
  if ((((lhs->exponent == 0) && (lhs->bits < 0x10)) && (rhs->exponent == 0)) && (rhs->bits < 0x10))
  {
    uVar7 = lhs->digits;
    if ((long)(int)uVar7 < 0x32) {
      uVar7 = (uint)""[(int)uVar7];
    }
    uVar6 = rhs->digits;
    if ((long)(int)uVar6 < 0x32) {
      uVar6 = (uint)""[(int)uVar6];
    }
    uVar2 = set->digits;
    lVar12 = (long)(int)uVar2;
    uVar10 = (ulong)uVar2;
    if (lVar12 < 0x32) {
      uVar10 = (ulong)""[lVar12];
    }
    uVar13 = uVar2;
    if ((int)uVar2 < 0x32) {
      uVar13 = (uint)""[lVar12];
    }
    puVar1 = res->lsu;
    puVar15 = puVar1;
    if ((int)uVar10 != 0) {
      puVar14 = lhs->lsu;
      puVar16 = rhs->lsu;
      puVar8 = puVar14 + ((ulong)uVar7 - 1);
      do {
        if (puVar8 < puVar14) {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)*puVar14;
        }
        if (rhs->lsu + ((ulong)uVar6 - 1) < puVar16) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)*puVar16;
        }
        *puVar15 = '\0';
        if ((char)uVar9 == '\0' && (char)uVar7 == '\0') {
          bVar3 = true;
        }
        else {
          *puVar15 = '\0';
          bVar3 = true;
          bVar11 = true;
          do {
            if (!bVar11) break;
            if ((uVar7 & uVar9 & 1) != 0) {
              *puVar15 = *puVar15 + '\x01';
            }
            if (1 < (uVar9 % 10 | uVar7 % 10)) {
              res->bits = '\0';
              res->lsu[0] = '\0';
              res->digits = 1;
              res->exponent = 0;
              res->bits = ' ';
              uprv_decContextSetStatus_63(set,0x80);
              bVar3 = false;
              break;
            }
            uVar9 = uVar9 / 10;
            uVar7 = uVar7 / 10;
            bVar11 = false;
          } while (puVar15 != res->lsu + (uVar10 - 1) || uVar2 != uVar13);
        }
        if (!bVar3) {
          return res;
        }
        puVar14 = puVar14 + 1;
        puVar16 = puVar16 + 1;
        puVar15 = puVar15 + 1;
      } while (puVar15 <= res->lsu + (uVar10 - 1));
    }
    iVar5 = (int)puVar15 - (int)puVar1;
    puVar8 = puVar1 + (long)iVar5 + -1;
    if (puVar1 <= puVar8) {
      iVar4 = ((int)puVar15 - (int)res) + -10;
      do {
        iVar5 = iVar4;
        if ((*puVar8 != '\0') || (iVar5 == 0)) {
          iVar5 = iVar5 + 1;
          break;
        }
        puVar8 = puVar8 + -1;
        iVar4 = iVar5 + -1;
      } while (puVar1 <= puVar8);
    }
    res->digits = iVar5;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    res->bits = ' ';
    uprv_decContextSetStatus_63(set,0x80);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAnd(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  const Unit *ua, *ub;                  /* -> operands  */
  const Unit *msua, *msub;              /* -> operand msus  */
  Unit *uc,  *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (lhs->exponent!=0 || decNumberIsSpecial(lhs) || decNumberIsNegative(lhs)
   || rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }

  /* operands are valid  */
  ua=lhs->lsu;                          /* bottom-up  */
  ub=rhs->lsu;                          /* ..  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(lhs->digits)-1;           /* -> msu of lhs  */
  msub=ub+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, ub++, uc++) {  /* Unit loop  */
    Unit a, b;                          /* extract units  */
    if (ua>msua) a=0;
     else a=*ua;
    if (ub>msub) b=0;
     else b=*ub;
    *uc=0;                              /* can now write back  */
    if (a|b) {                          /* maybe 1 bits to examine  */
      Int i, j;
      *uc=0;                            /* can now write back  */
      /* This loop could be unrolled and/or use BIN2BCD tables  */
      for (i=0; i<DECDPUN; i++) {
        if (a&b&1) *uc=*uc+(Unit)powers[i];  /* effect AND  */
        j=a%10;
        a=a/10;
        j|=b%10;
        b=b/10;
        if (j>1) {
          decStatus(res, DEC_Invalid_operation, set);
          return res;
          }
        if (uc==msuc && i==msudigs-1) break; /* just did final digit  */
        } /* each digit  */
      } /* both OK  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }